

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O2

int __thiscall
flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>::clone
          (BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  _Alloc_hider local_28;
  Value *local_20;
  Value *local_18;
  
  local_20 = (Value *)**(size_type **)(__fn + 0x50);
  local_28._M_p = (pointer)(*(size_type **)(__fn + 0x50))[1];
  std::
  make_unique<flow::BinaryInstr<(flow::BinaryOperator)8,(flow::LiteralType)2>,flow::Value*,flow::Value*,std::__cxx11::string_const&>
            (&local_18,&local_20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)local_18;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> clone() override {
    return std::make_unique<BinaryInstr<Operator, ResultType>>(
        operand(0), operand(1), name());
  }